

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.h
# Opt level: O0

int fmt::v11::detail::parse_nonnegative_int<char>(char **begin,char *end,int error_value)

{
  char *pcVar1;
  bool bVar2;
  char *pcVar3;
  uint local_50;
  uint max;
  int digits10;
  long num_digits;
  char *p;
  uint local_28;
  uint prev;
  uint value;
  int error_value_local;
  char *end_local;
  char **begin_local;
  
  if (((*begin != end) && ('/' < **begin)) && (**begin < ':')) {
    local_28 = 0;
    pcVar3 = *begin;
    begin_local._4_4_ = local_28;
    do {
      local_28 = begin_local._4_4_;
      num_digits = (long)pcVar3;
      begin_local._4_4_ = local_28 * 10 + *(char *)num_digits + -0x30;
      pcVar3 = (char *)(num_digits + 1);
      bVar2 = false;
      if ((pcVar3 != end) && (bVar2 = false, '/' < *pcVar3)) {
        bVar2 = *pcVar3 < ':';
      }
    } while (bVar2);
    pcVar1 = *begin;
    *begin = pcVar3;
    if (9 < (long)pcVar3 - (long)pcVar1) {
      local_50 = error_value;
      if (((long)pcVar3 - (long)pcVar1 == 10) &&
         ((ulong)local_28 * 10 + (ulong)((int)*(char *)num_digits - 0x30) < 0x80000000)) {
        local_50 = begin_local._4_4_;
      }
      begin_local._4_4_ = local_50;
    }
    return begin_local._4_4_;
  }
  assert_fail("/workspace/llm4binary/github/license_c_cmakelists/DiscordPP[P]echo-bot/build_O0/_deps/fmt-src/include/fmt/base.h"
              ,0x513,"");
}

Assistant:

FMT_CONSTEXPR auto parse_nonnegative_int(const Char*& begin, const Char* end,
                                         int error_value) noexcept -> int {
  FMT_ASSERT(begin != end && '0' <= *begin && *begin <= '9', "");
  unsigned value = 0, prev = 0;
  auto p = begin;
  do {
    prev = value;
    value = value * 10 + unsigned(*p - '0');
    ++p;
  } while (p != end && '0' <= *p && *p <= '9');
  auto num_digits = p - begin;
  begin = p;
  int digits10 = static_cast<int>(sizeof(int) * CHAR_BIT * 3 / 10);
  if (num_digits <= digits10) return static_cast<int>(value);
  // Check for overflow.
  unsigned max = INT_MAX;
  return num_digits == digits10 + 1 &&
                 prev * 10ull + unsigned(p[-1] - '0') <= max
             ? static_cast<int>(value)
             : error_value;
}